

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.cpp
# Opt level: O2

bool __thiscall sjtu::TrainManager::buy_ticket(TrainManager *this,orderType *order)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  orderType *poVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  orderstatus oVar6;
  undefined4 extraout_var;
  ulong uVar7;
  int *piVar8;
  trainType *ptVar9;
  int i;
  long lVar10;
  uint uVar11;
  pair<long,_bool> pVar12;
  allocator local_116;
  allocator local_115;
  int local_114;
  ulong local_110;
  orderType *local_108;
  trainType *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong local_e0;
  char (*local_d8) [41];
  char (*local_d0) [41];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  timeType *local_a8;
  long local_a0;
  char local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  trainType *this_01;
  
  this_00 = this->TrainBpTree;
  local_108 = order;
  std::__cxx11::string::string((string *)&local_50,order->trainID,(allocator *)&local_90);
  local_c8._M_dataplus._M_p =
       (pointer)StringHasher::operator()((StringHasher *)&this->field_0x10,&local_50);
  pVar12 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (this_00,(unsigned_long_long *)&local_c8);
  local_a0 = pVar12.first;
  local_98 = pVar12.second;
  std::__cxx11::string::~string((string *)&local_50);
  if (local_98 != '\0') {
    iVar3 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2])
                      (this->TrainFile,&local_a0);
    poVar1 = local_108;
    this_01 = (trainType *)CONCAT44(extraout_var,iVar3);
    iVar3 = local_108->num;
    local_a8 = local_108->date;
    iVar4 = timeType::dateminus(local_a8,this_01->saleDate);
    local_d0 = poVar1->station;
    std::__cxx11::string::string((string *)&local_70,*local_d0,(allocator *)&local_c8);
    local_100 = this_01;
    iVar5 = trainType::get_Delta_date(this_01,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    ptVar9 = local_100;
    uVar11 = iVar5 + iVar4;
    if (((-1 < (int)uVar11) &&
        (iVar4 = timeType::dateminus(local_100->saleDate + 1,this_01->saleDate),
        (int)uVar11 <= iVar4)) && (ptVar9->is_released != false)) {
      if (ptVar9->seatNum < local_108->num) {
        return false;
      }
      local_e8 = 0;
      uStack_f0._0_4_ = (ptVar9->startTime).hour;
      uStack_f0._4_4_ = (ptVar9->startTime).minute;
      local_f8 = *(pointer *)local_108->date;
      local_e0 = (ulong)uVar11;
      local_d8 = local_108->station + 1;
      piVar8 = &ptVar9->stations[0].travelTime;
      local_110 = 0;
      local_114 = iVar3;
      for (lVar10 = 0; lVar10 < local_100->stationNum; lVar10 = lVar10 + 1) {
        if (lVar10 != 0) {
          timeType::operator+((timeType *)&local_c8,(int *)&local_f8);
          local_f8 = local_c8._M_dataplus._M_p;
          uStack_f0 = local_c8._M_string_length;
        }
        if ((local_110 & 1) != 0) {
          local_e8 = (ulong)(uint)((int)local_e8 + piVar8[-2]);
          if (piVar8[local_e0 - 0x5e] <= local_114) {
            local_114 = piVar8[local_e0 - 0x5e];
          }
        }
        std::__cxx11::string::string((string *)&local_c8,(char *)(piVar8 + -0x69),&local_115);
        std::__cxx11::string::string((string *)&local_90,*local_d8,&local_116);
        _Var2 = std::operator==(&local_c8,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_c8);
        if (_Var2) {
          local_108->date[1].month = (int)local_f8;
          local_108->date[1].day = local_f8._4_4_;
          local_108->date[1].hour = (int)uStack_f0;
          local_108->date[1].minute = uStack_f0._4_4_;
          local_108->price = (int)local_e8;
          if ((local_110 & 1) == 0) {
            return false;
          }
          if (local_114 != local_108->num) {
            oVar6 = pending;
            goto LAB_00114619;
          }
          lVar10 = 0;
          uVar7 = 0;
          ptVar9 = local_100;
          goto LAB_00114502;
        }
        if (lVar10 != 0) {
          timeType::operator+((timeType *)&local_c8,(int *)&local_f8);
          local_f8 = local_c8._M_dataplus._M_p;
          uStack_f0 = local_c8._M_string_length;
        }
        std::__cxx11::string::string((string *)&local_c8,(char *)(piVar8 + -0x69),&local_115);
        std::__cxx11::string::string((string *)&local_90,*local_d0,&local_116);
        _Var2 = std::operator==(&local_c8,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_c8);
        if (_Var2) {
          local_f8 = *(pointer *)local_a8;
          *(pointer *)local_a8 = local_f8;
          local_a8->hour = (int)uStack_f0;
          local_a8->minute = uStack_f0._4_4_;
          local_110 = CONCAT71((int7)(uStack_f0 >> 8),1);
        }
        piVar8 = piVar8 + 0x6a;
      }
    }
  }
  return false;
LAB_00114502:
  if (local_100->stationNum <= lVar10) {
LAB_00114617:
    oVar6 = success;
LAB_00114619:
    local_108->status = oVar6;
    (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
              (this->TrainFile,&local_100->offset);
    return true;
  }
  if ((uVar7 & 1) != 0) {
    piVar8 = ptVar9->stations[0].seatNum + local_e0;
    *piVar8 = *piVar8 - local_108->num;
  }
  local_110 = uVar7;
  std::__cxx11::string::string((string *)&local_c8,ptVar9->stations[0].stationName,&local_115);
  std::__cxx11::string::string((string *)&local_90,*local_d8,&local_116);
  _Var2 = std::operator==(&local_c8,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_c8);
  if (_Var2) goto LAB_00114617;
  std::__cxx11::string::string((string *)&local_c8,ptVar9->stations[0].stationName,&local_115);
  std::__cxx11::string::string((string *)&local_90,*local_d0,&local_116);
  _Var2 = std::operator==(&local_c8,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_c8);
  uVar7 = CONCAT71((int7)(local_110 >> 8),(byte)local_110 | _Var2);
  lVar10 = lVar10 + 1;
  ptVar9 = (trainType *)(ptVar9->stations[0].seatNum + 0x57);
  goto LAB_00114502;
}

Assistant:

bool TrainManager::buy_ticket(orderType *order)
	{
		auto ret = TrainBpTree -> find(hasher(order -> trainID));
		if (ret.second == false) return 0;
		else
		{
			trainType *train = TrainFile -> read(ret.first);
			int min_ticket_num = order -> num , day_id = timeType::dateminus(order -> date[0] , train -> saleDate[0]) + train -> get_Delta_date(std::string(order -> station[0])) , single_ticket_price = 0;
			if (day_id < 0 || day_id > timeType::dateminus(train -> saleDate[1] , train -> saleDate[0]) || train -> is_released == false || order -> num > train -> seatNum) return 0;
			else
			{
				timeType current_time = train -> startTime;
				current_time.month = order -> date[0].month , current_time.day = order -> date[0].day;
				bool flag = false , end_flag = false;
				for (int i = 0;i < train -> stationNum;++ i)
				{
					if (i) current_time = current_time + train -> stations[i].travelTime;
					if (flag) single_ticket_price += train -> stations[i].price , min_ticket_num = min(min_ticket_num , train -> stations[i].seatNum[day_id]);
					if (std::string(train -> stations[i].stationName) == std::string(order -> station[1]))
					{
						order -> date[1] = current_time , order -> price = single_ticket_price , end_flag = true;
						break;
					}
					if (i) current_time = current_time + train -> stations[i].stopoverTime;
					if (std::string(train -> stations[i].stationName) == std::string(order -> station[0]))
					{
						current_time.month = order -> date[0].month , current_time.day = order -> date[0].day;
						order -> date[0] = current_time , flag = true;
					}
				}
				if (!flag || !end_flag) return false;
				if (min_ticket_num == order -> num)
				{
					flag = false;
					for (int i = 0;i < train -> stationNum;++ i)
					{
						if (flag) train -> stations[i].seatNum[day_id] -= order -> num;
						if (std::string(train -> stations[i].stationName) == std::string(order -> station[1])) break;
						if (std::string(train -> stations[i].stationName) == std::string(order -> station[0])) flag = true;
					}
					order -> status = success;
				}
				else order -> status = pending;
				TrainFile -> save(train -> offset);
				return true;
			}
		}
	}